

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void SimpleLoggerMgr::handleSegFault(int sig)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_0000003c;
  string local_40;
  atomic<SimpleLoggerMgr_*> this;
  
  this._M_b._M_p = instance._M_b._M_p;
  if (instance._M_b._M_p == (__pointer_type)0x0) {
    iVar2 = init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,sig));
    this._M_b._M_p = (__base_type)CONCAT44(extraout_var,iVar2);
  }
  signal(0xb,(__sighandler_t)((__pointer_type)this._M_b._M_p)->oldSigSegvHandler);
  enableOnlyOneDisplayer((SimpleLoggerMgr *)this._M_b._M_p);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Segmentation fault","");
  flushAllLoggers((SimpleLoggerMgr *)this._M_b._M_p,1,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  logStackBacktrace((SimpleLoggerMgr *)this._M_b._M_p,60000);
  puts("[SEG FAULT] Flushed all logs safely.");
  fflush(_stdout);
  bVar1 = chkExitOnCrash((SimpleLoggerMgr *)this._M_b._M_p);
  if (!bVar1) {
    if (((__pointer_type)this._M_b._M_p)->oldSigSegvHandler != (_func_void_int *)0x0) {
      (*((__pointer_type)this._M_b._M_p)->oldSigSegvHandler)(sig);
    }
    return;
  }
  puts("[SEG FAULT] Exit on crash.");
  fflush(_stdout);
  exit(-1);
}

Assistant:

void SimpleLoggerMgr::handleSegFault(int sig) {
#if defined(__linux__) || defined(__APPLE__)
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    signal(SIGSEGV, mgr->oldSigSegvHandler);
    mgr->enableOnlyOneDisplayer();
    mgr->flushAllLoggers(1, "Segmentation fault");
    mgr->logStackBacktrace();

    printf("[SEG FAULT] Flushed all logs safely.\n");
    fflush(stdout);

    if (mgr->chkExitOnCrash()) {
        printf("[SEG FAULT] Exit on crash.\n");
        fflush(stdout);
        exit(-1);
    }

    if (mgr->oldSigSegvHandler) {
        mgr->oldSigSegvHandler(sig);
    }
#endif
}